

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderResourceCacheGL::CachedResourceView::Set
          (CachedResourceView *this,RefCntAutoPtr<Diligent::TextureViewGLImpl> *pTexView,
          bool SetSampler)

{
  TextureBaseGL *pSrcPtr;
  SamplerGLImpl *pSVar1;
  long lVar2;
  TextureViewGLImpl *pTVar3;
  
  pTVar3 = pTexView->m_pObject;
  if (pTVar3 == (TextureViewGLImpl *)0x0) {
    lVar2 = 8;
    pSVar1 = (SamplerGLImpl *)0x0;
  }
  else {
    pSrcPtr = (TextureBaseGL *)
              (pTVar3->super_TextureViewBase<Diligent::EngineGLImplTraits>).m_pTexture;
    if (pSrcPtr != (TextureBaseGL *)0x0) {
      CheckDynamicType<Diligent::TextureBaseGL,Diligent::ITexture>((ITexture *)pSrcPtr);
      pTVar3 = pTexView->m_pObject;
    }
    this->pTexture = pSrcPtr;
    if (!SetSampler || pTVar3 == (TextureViewGLImpl *)0x0) goto LAB_002d2a3f;
    pSVar1 = RefCntAutoPtr<Diligent::ISampler>::RawPtr<Diligent::SamplerGLImpl>
                       (&(pTVar3->super_TextureViewBase<Diligent::EngineGLImplTraits>).m_pSampler);
    lVar2 = 0x10;
  }
  *(SamplerGLImpl **)((long)&(this->pView).m_pObject + lVar2) = pSVar1;
LAB_002d2a3f:
  RefCntAutoPtr<Diligent::IDeviceObject>::operator=(&this->pView,pTexView);
  return;
}

Assistant:

void Set(RefCntAutoPtr<TextureViewGLImpl>&& pTexView, bool SetSampler)
        {
            // Do not null out pSampler as it could've been initialized by PipelineResourceSignatureGLImpl::InitSRBResourceCache!
            // pSampler = nullptr;

            // Avoid unnecessary virtual call
            pTexture = pTexView ? pTexView->GetTexture<TextureBaseGL>() : nullptr;
            if (pTexView && SetSampler)
            {
                pSampler = pTexView->GetSampler<SamplerGLImpl>();
            }

            pView = std::move(pTexView);
        }